

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O2

void bssl::internal::DeleterImpl<stack_st_ACCESS_DESCRIPTION,_void>::Free
               (stack_st_ACCESS_DESCRIPTION *sk)

{
  OPENSSL_sk_pop_free_ex
            ((OPENSSL_STACK *)sk,Free::anon_class_1_0_00000001::__invoke,(OPENSSL_sk_free_func)0x0);
  return;
}

Assistant:

static void Free(Stack *sk) {
    // sk_FOO_pop_free is defined by macros and bound by name, so we cannot
    // access it from C++ here.
    using Type = typename StackTraits<Stack>::Type;
    OPENSSL_sk_pop_free_ex(
        reinterpret_cast<OPENSSL_STACK *>(sk),
        [](OPENSSL_sk_free_func /* unused */, void *ptr) {
          DeleterImpl<Type>::Free(reinterpret_cast<Type *>(ptr));
        },
        nullptr);
  }